

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int moveto_snode_check(lys_node *node,lyxp_node_type root_type,char *node_name,
                      lys_module *moveto_mod,int options)

{
  int iVar1;
  lys_node *node_00;
  lys_module *plVar2;
  bool bVar3;
  
  node_00 = node;
  do {
    node_00 = lys_parent(node_00);
    bVar3 = node_00 == (lys_node *)0x0;
    if (bVar3) break;
  } while (node_00->nodetype == LYS_USES);
  if ((options & 0x20U) == 0) {
    if ((!bVar3) && (node_00->nodetype == LYS_OUTPUT)) {
      return -1;
    }
  }
  else if ((!bVar3) && (node_00->nodetype == LYS_INPUT)) {
    return -1;
  }
  if ((moveto_mod != (lys_module *)0x0) && (plVar2 = lys_node_module(node), plVar2 != moveto_mod)) {
    return -1;
  }
  if ((root_type != LYXP_NODE_ROOT_CONFIG) || (iVar1 = -1, (node->flags & 2) == 0)) {
    if ((node->name != node_name) && (iVar1 = strcmp(node_name,"*"), iVar1 != 0)) {
      return -1;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
moveto_snode_check(const struct lys_node *node, enum lyxp_node_type root_type, const char *node_name,
                   struct lys_module *moveto_mod, int options)
{
    struct lys_node *parent;

    /* RPC input/output check */
    for (parent = lys_parent(node); parent && (parent->nodetype == LYS_USES); parent = lys_parent(parent));
    if (options & LYXP_SNODE_OUTPUT) {
        if (parent && (parent->nodetype == LYS_INPUT)) {
            return -1;
        }
    } else {
        if (parent && (parent->nodetype == LYS_OUTPUT)) {
            return -1;
        }
    }

    /* module check */
    if (moveto_mod && (lys_node_module(node) != moveto_mod)) {
        return -1;
    }

    /* context check */
    if ((root_type == LYXP_NODE_ROOT_CONFIG) && (node->flags & LYS_CONFIG_R)) {
        return -1;
    }

    /* name check */
    if (!ly_strequal(node->name, node_name, 1) && strcmp(node_name, "*")) {
        return -1;
    }

    /* match */
    return EXIT_SUCCESS;
}